

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::JavaHprofConfig::ParseFromArray(JavaHprofConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer puVar2;
  uint uVar3;
  undefined1 uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint *extraout_RDX;
  uint *puVar9;
  bool bVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint uVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  uint *puVar18;
  bool bVar19;
  uint *local_88;
  Field local_80;
  uint *local_70;
  JavaHprofConfig *local_68;
  uint *local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = &this->process_cmdline_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->process_cmdline_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_58 = &this->pid_;
  local_40 = &this->target_installed_by_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_40,(this->target_installed_by_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_48 = &this->ignored_types_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_48,(this->ignored_types_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_50 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar18 = (uint *)(size + (long)raw);
  puVar9 = extraout_RDX;
  do {
    lVar8 = 7;
    if (puVar18 <= raw) goto LAB_0023eec9;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar17 = (uint *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar6 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar13 = puVar17;
      for (lVar7 = lVar8;
          (puVar15 = puVar13, uVar12 = uVar6, (char)bVar1 < '\0' &&
          (bVar19 = 0x38 < lVar7 - 7U, bVar10 = bVar19 || puVar18 <= puVar13, puVar9 = puVar13,
          puVar15 = puVar17, uVar12 = 0, !bVar19 && puVar18 > puVar13)); lVar7 = lVar7 + 7) {
        bVar1 = (byte)*puVar13;
        puVar13 = (uint *)((long)puVar13 + 1);
        uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
        puVar9 = puVar13;
      }
      puVar17 = puVar15;
      if (bVar10) {
        puVar17 = (uint *)raw;
        uVar12 = 0;
      }
      if (puVar17 == (uint *)raw) goto LAB_0023eec9;
    }
    uVar5 = (uint)(uVar12 >> 3);
    if ((uVar5 == 0) || (puVar18 <= puVar17)) {
switchD_0023ed43_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_80.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        puVar11 = (uint *)0x0;
        bVar10 = puVar17 >= puVar18;
        if (puVar17 < puVar18) {
          puVar9 = (uint *)((long)puVar17 + 1);
          puVar13 = (uint *)(ulong)((byte)*puVar17 & 0x7f);
          puVar15 = puVar13;
          uVar14 = 0;
          if ((char)(byte)*puVar17 < '\0') {
            puVar15 = (uint *)0x0;
            uVar14 = 0;
            lVar8 = 7;
            puVar16 = puVar9;
            do {
              bVar19 = 0x38 < lVar8 - 7U;
              bVar10 = bVar19 || puVar18 <= puVar16;
              if (bVar19 || puVar18 <= puVar16) goto LAB_0023eed0;
              uVar3 = *puVar16;
              puVar16 = (uint *)((long)puVar16 + 1);
              puVar13 = (uint *)((ulong)puVar13 |
                                (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 7;
            } while ((char)(byte)uVar3 < '\0');
            puVar15 = (uint *)((ulong)puVar13 & 0xffffffff);
            puVar9 = puVar16;
            uVar14 = (uint)((ulong)puVar13 >> 0x20);
          }
        }
        else {
          puVar15 = (uint *)0x0;
          uVar14 = 0;
        }
LAB_0023eed0:
        puVar13 = (uint *)(ulong)uVar14;
        if (bVar10) {
          puVar9 = puVar17;
          puVar13 = puVar11;
          puVar15 = puVar11;
        }
        local_88 = puVar17;
        local_60 = (uint *)raw;
        if (puVar9 != puVar17) goto LAB_0023eef7;
        uVar12 = 0;
        bVar10 = false;
        local_80.int_value_ = (uint64_t)puVar11;
        goto LAB_0023ef39;
      case 1:
        puVar9 = puVar17 + 2;
        if (puVar18 < puVar9) {
LAB_0023eec9:
          uVar12 = 0;
          bVar10 = false;
          local_80.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_0023ef39;
        }
        puVar15 = *(uint **)puVar17;
        puVar13 = (uint *)((ulong)puVar15 >> 0x20);
        break;
      case 2:
        bVar10 = puVar17 >= puVar18;
        puVar13 = local_70;
        if (puVar17 < puVar18) {
          bVar1 = (byte)*puVar17;
          puVar11 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar15 = (uint *)((long)puVar17 + 1U);
          for (; (puVar9 = puVar15, puVar13 = puVar11, (char)bVar1 < '\0' &&
                 (bVar19 = 0x38 < lVar8 - 7U, bVar10 = bVar19 || puVar18 <= puVar15,
                 puVar9 = (uint *)((long)puVar17 + 1U), puVar13 = local_70,
                 !bVar19 && puVar18 > puVar15)); lVar8 = lVar8 + 7) {
            bVar1 = (byte)*puVar15;
            puVar15 = (uint *)((long)puVar15 + 1);
            puVar11 = (uint *)((ulong)puVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f));
          }
        }
        local_70 = puVar13;
        if (bVar10) {
          puVar9 = puVar17;
          local_70 = (uint *)0x0;
        }
        if ((puVar9 == puVar17) || ((uint *)((long)puVar18 - (long)puVar9) < local_70)) {
          puVar13 = (uint *)0x0;
          puVar15 = (uint *)0x0;
          bVar10 = false;
          puVar11 = (uint *)0x0;
        }
        else {
          puVar13 = (uint *)((ulong)puVar9 >> 0x20);
          puVar15 = (uint *)((ulong)puVar9 & 0xffffffff);
          puVar9 = (uint *)((long)puVar9 + (long)local_70);
          bVar10 = true;
          puVar11 = local_70;
        }
        local_88 = puVar17;
        if (!bVar10) goto LAB_0023eec9;
        goto LAB_0023eef7;
      default:
        goto switchD_0023ed43_caseD_3;
      case 5:
        puVar9 = puVar17 + 1;
        puVar13 = (uint *)0x0;
        if (puVar18 < puVar9) goto LAB_0023eec9;
        puVar15 = (uint *)(ulong)*puVar17;
      }
      puVar11 = (uint *)0x0;
LAB_0023eef7:
      bVar10 = true;
      raw = puVar9;
      if ((uVar5 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
        local_80.int_value_ = (ulong)puVar15 & 0xffffffff | (long)puVar13 << 0x20;
        uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_80.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_0023ef39:
    puVar17 = &switchD_0023ed43::switchdataD_0034daec;
    if (!bVar10) {
      local_80.size_ = (uint32_t)uVar12;
      local_80.type_ = (uint8_t)(uVar12 >> 0x30);
      local_80.id_ = (uint16_t)(uVar12 >> 0x20);
      local_68 = this;
      do {
        if (local_80.id_ == 0) {
          return puVar18 == (uint *)raw;
        }
        if ((ushort)(uVar12 >> 0x20) < 8) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        uVar5 = ((uint)(uVar12 >> 0x20) & 0xffff) - 1;
        if (uVar5 < 7) {
          uVar4 = (*(code *)(&DAT_0034db04 + *(int *)(&DAT_0034db04 + (ulong)uVar5 * 4)))();
          return (bool)uVar4;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_80,local_50);
        do {
          if (puVar18 <= raw) goto LAB_0023f3a9;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar9 = (uint *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar6 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            uVar12 = uVar6;
            puVar13 = puVar9;
            if ((char)(byte)*raw < '\0') {
              lVar8 = 7;
              puVar15 = puVar9;
              do {
                bVar10 = 0x38 < lVar8 - 7U || puVar18 <= puVar15;
                uVar12 = 0;
                puVar13 = puVar9;
                if (bVar10) break;
                uVar5 = *puVar15;
                puVar13 = (uint *)((long)puVar15 + 1);
                uVar6 = uVar6 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar8 & 0x3f);
                lVar8 = lVar8 + 7;
                uVar12 = uVar6;
                puVar15 = puVar13;
              } while ((char)(byte)uVar5 < '\0');
            }
            puVar9 = puVar13;
            if (bVar10) {
              puVar9 = (uint *)raw;
              uVar12 = 0;
            }
            if (puVar9 == (uint *)raw) goto LAB_0023f3a9;
          }
          uVar5 = (uint)(uVar12 >> 3);
          if ((uVar5 == 0) || (puVar18 <= puVar9)) {
switchD_0023f1fb_caseD_3:
            bVar10 = false;
            uVar12 = 0;
            local_80.int_value_ = (uint64_t)(uint *)0x0;
          }
          else {
            switch((uint)uVar12 & 7) {
            case 0:
              puVar11 = (uint *)0x0;
              bVar10 = puVar9 >= puVar18;
              if (puVar9 < puVar18) {
                puVar13 = (uint *)((long)puVar9 + 1);
                uVar14 = (byte)*puVar9 & 0x7f;
                uVar6 = (ulong)uVar14;
                puVar15 = (uint *)(ulong)uVar14;
                puVar17 = puVar13;
                uVar14 = 0;
                if ((char)(byte)*puVar9 < '\0') {
                  puVar15 = (uint *)0x0;
                  lVar8 = 7;
                  puVar16 = puVar13;
                  do {
                    bVar19 = 0x38 < lVar8 - 7U;
                    bVar10 = bVar19 || puVar18 <= puVar16;
                    puVar17 = puVar13;
                    uVar14 = 0;
                    if (bVar19 || puVar18 <= puVar16) break;
                    bVar1 = (byte)*puVar16;
                    puVar16 = (uint *)((long)puVar16 + 1);
                    uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
                    lVar8 = lVar8 + 7;
                    if (-1 < (char)bVar1) {
                      puVar15 = (uint *)(uVar6 & 0xffffffff);
                    }
                    puVar17 = puVar16;
                    uVar14 = (uint)(uVar6 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar15 = (uint *)0x0;
                uVar14 = 0;
              }
              if (bVar10) {
                puVar15 = puVar11;
              }
              puVar13 = (uint *)(ulong)uVar14;
              if (bVar10) {
                puVar17 = puVar9;
                puVar13 = puVar11;
              }
              this = local_68;
              local_70 = puVar9;
              local_60 = (uint *)raw;
              if (puVar17 != puVar9) goto LAB_0023f3d1;
              uVar12 = 0;
              bVar10 = false;
              local_80.int_value_ = (uint64_t)puVar11;
              goto LAB_0023f41c;
            case 1:
              puVar17 = puVar9 + 2;
              if (puVar18 < puVar17) {
LAB_0023f3a9:
                uVar12 = 0;
                bVar10 = false;
                local_80.int_value_ = (uint64_t)(uint *)0x0;
                goto LAB_0023f41c;
              }
              puVar15 = *(uint **)puVar9;
              puVar13 = (uint *)((ulong)puVar15 >> 0x20);
              break;
            case 2:
              bVar10 = puVar9 >= puVar18;
              puVar13 = local_88;
              if (puVar9 < puVar18) {
                puVar15 = (uint *)((long)puVar9 + 1);
                puVar11 = (uint *)(ulong)((byte)*puVar9 & 0x7f);
                puVar17 = puVar15;
                puVar13 = puVar11;
                if ((char)(byte)*puVar9 < '\0') {
                  lVar8 = 7;
                  puVar16 = puVar15;
                  do {
                    bVar10 = 0x38 < lVar8 - 7U || puVar18 <= puVar16;
                    puVar17 = puVar15;
                    puVar13 = local_88;
                    if (bVar10) break;
                    uVar14 = *puVar16;
                    puVar16 = (uint *)((long)puVar16 + 1);
                    puVar11 = (uint *)((ulong)puVar11 |
                                      (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar8 & 0x3f));
                    lVar8 = lVar8 + 7;
                    puVar17 = puVar16;
                    puVar13 = puVar11;
                  } while ((char)(byte)uVar14 < '\0');
                }
              }
              local_88 = puVar13;
              puVar15 = (uint *)0x0;
              if (bVar10) {
                puVar17 = puVar9;
                local_88 = puVar15;
              }
              if (puVar17 == puVar9) {
                puVar13 = (uint *)0x0;
                bVar10 = false;
                puVar11 = (uint *)0x0;
              }
              else if ((uint *)((long)puVar18 - (long)puVar17) < local_88) {
                puVar15 = (uint *)0x0;
                puVar13 = (uint *)0x0;
                bVar10 = false;
                puVar11 = (uint *)0x0;
              }
              else {
                puVar13 = (uint *)((ulong)puVar17 >> 0x20);
                puVar15 = (uint *)((ulong)puVar17 & 0xffffffff);
                puVar17 = (uint *)((long)puVar17 + (long)local_88);
                bVar10 = true;
                puVar11 = local_88;
              }
              this = local_68;
              if (!bVar10) goto LAB_0023f3a9;
              goto LAB_0023f3d1;
            default:
              goto switchD_0023f1fb_caseD_3;
            case 5:
              puVar17 = puVar9 + 1;
              puVar13 = (uint *)0x0;
              if (puVar18 < puVar17) goto LAB_0023f3a9;
              puVar15 = (uint *)(ulong)*puVar9;
            }
            puVar11 = (uint *)0x0;
LAB_0023f3d1:
            raw = puVar17;
            bVar10 = true;
            puVar17 = (uint *)raw;
            if ((uVar5 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
              local_80.int_value_ = (ulong)puVar15 & 0xffffffff | (long)puVar13 << 0x20;
              uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
              bVar10 = false;
            }
            else {
              local_80.int_value_ = 0;
              uVar12 = 0;
            }
          }
LAB_0023f41c:
        } while (bVar10);
        local_80.size_ = (uint32_t)uVar12;
        local_80.type_ = (uint8_t)(uVar12 >> 0x30);
        local_80.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool JavaHprofConfig::ParseFromArray(const void* raw, size_t size) {
  process_cmdline_.clear();
  pid_.clear();
  target_installed_by_.clear();
  ignored_types_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* process_cmdline */:
        process_cmdline_.emplace_back();
        field.get(&process_cmdline_.back());
        break;
      case 2 /* pid */:
        pid_.emplace_back();
        field.get(&pid_.back());
        break;
      case 7 /* target_installed_by */:
        target_installed_by_.emplace_back();
        field.get(&target_installed_by_.back());
        break;
      case 3 /* continuous_dump_config */:
        (*continuous_dump_config_).ParseFromArray(field.data(), field.size());
        break;
      case 4 /* min_anonymous_memory_kb */:
        field.get(&min_anonymous_memory_kb_);
        break;
      case 5 /* dump_smaps */:
        field.get(&dump_smaps_);
        break;
      case 6 /* ignored_types */:
        ignored_types_.emplace_back();
        field.get(&ignored_types_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}